

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::FilteredDirectoryContentsTask::start
          (FilteredDirectoryContentsTask *this,TaskInterface ti)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringRef str;
  StringRef str_00;
  BuildKey local_70;
  long *local_50 [2];
  long local_40 [2];
  TaskInterface local_30;
  
  local_30.ctx = ti.ctx;
  local_30.impl = ti.impl;
  str.Data = (this->path)._M_dataplus._M_p;
  str.Length = (this->path)._M_string_length;
  llbuild::buildsystem::BuildKey::BuildKey(&local_70,'N',str);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_70.key.key._M_dataplus._M_p,
             local_70.key.key._M_dataplus._M_p + local_70.key.key._M_string_length);
  llbuild::core::TaskInterface::request(&local_30,(KeyType *)local_50,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  paVar1 = &local_70.key.key.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.key.key._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.key.key._M_dataplus._M_p,
                    local_70.key.key.field_2._M_allocated_capacity + 1);
  }
  str_00.Data = (this->path)._M_dataplus._M_p;
  str_00.Length = (this->path)._M_string_length;
  llbuild::buildsystem::BuildKey::BuildKey(&local_70,'I',str_00);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_70.key.key._M_dataplus._M_p,
             local_70.key.key._M_dataplus._M_p + local_70.key.key._M_string_length);
  llbuild::core::TaskInterface::request(&local_30,(KeyType *)local_50,1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.key.key._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.key.key._M_dataplus._M_p,
                    local_70.key.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // FIXME:
    //
    //engine.taskMustFollow(this, BuildKey::makeNode(path).toData());
    //
    // The taskMustFollow method expresses the weak dependency we have on
    // 'path', but only at the task level. What we really want is to say at the
    // 'isResultValid'/scanning level is 'must scan after'. That way we hold up
    // this and downstream rules until the 'path' node has been set into its
    // final state*.
    //
    // Here we depend on the file node so that it can be connected up to
    // potential producers and the raw stat information, in case something else
    // has changed the contents of the directory. The value does not encode the
    // raw stat information, thus will produce the same result if the filtered
    // contents is otherwise the same. This reduces unnecessary rebuilds. That
    // said, we are still subject to the 'final state' problem:
    //
    // * The 'final state' of a directory is also a thorny patch of toxic land
    // mines. We really want directory contents to weakly depend upon anything
    // that is currently and/or may be altered within it. i.e. if one rule
    // creates the directory and another rule writes a file into it, we want to
    // defer scanning until both of them have been scanned and possibly run.
    // Having a 'must scan after' would help with the first rule (mkdir), but
    // not the second, in particular if rules are added in subsequent builds.
    // Related rdar://problem/30638921
    ti.request(BuildKey::makeNode(path).toData(), /*inputID=*/0);
    ti.request(BuildKey::makeStat(path).toData(), /*inputID=*/1);
  }